

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem.cc
# Opt level: O0

void * __thiscall cnn::CPUAllocator::malloc(CPUAllocator *this,size_t __size)

{
  int iVar1;
  ostream *poVar2;
  void *this_00;
  string *what_arg;
  void *ptr;
  allocator *this_01;
  allocator local_59;
  string local_58 [32];
  void *local_38;
  size_t local_30;
  CPUAllocator *local_28;
  void *local_20;
  size_t local_18;
  size_t local_10;
  void *local_8;
  
  local_18 = (size_t)(this->super_MemAllocator).align;
  local_30 = __size;
  local_28 = this;
  local_10 = __size;
  if (local_18 == 1) {
    local_8 = ::malloc(__size);
  }
  else {
    if (((local_18 & local_18 - 1) == 0) && (local_18 < 8)) {
      local_18 = 8;
    }
    iVar1 = posix_memalign(&local_20,local_18,__size);
    if (iVar1 == 0) {
      local_8 = local_20;
    }
    else {
      local_8 = (void *)0x0;
    }
  }
  local_38 = local_8;
  if (local_8 == (void *)0x0) {
    poVar2 = std::operator<<((ostream *)&std::cerr,"CPU memory allocation failed n=");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_30);
    poVar2 = std::operator<<(poVar2," align=");
    this_00 = (void *)std::ostream::operator<<(poVar2,(this->super_MemAllocator).align);
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
    what_arg = (string *)__cxa_allocate_exception(0x10);
    this_01 = &local_59;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_58,"CPU memory allocation failed",this_01);
    out_of_memory::out_of_memory((out_of_memory *)this_01,what_arg);
    __cxa_throw(what_arg,&out_of_memory::typeinfo,out_of_memory::~out_of_memory);
  }
  return local_8;
}

Assistant:

void* CPUAllocator::malloc(size_t n) {
  void* ptr = _mm_malloc(n, align);
  if (!ptr) {
    cerr << "CPU memory allocation failed n=" << n << " align=" << align << endl;
    throw cnn::out_of_memory("CPU memory allocation failed");
  }
  return ptr;
}